

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O1

RepeatedPtrField<google::protobuf::MessageLite> *
google::protobuf::Arena::
CreateMessageInternal<google::protobuf::RepeatedPtrField<google::protobuf::MessageLite>>
          (Arena *arena)

{
  RepeatedPtrField<google::protobuf::MessageLite> *pRVar1;
  pair<void_*,_google::protobuf::internal::SerialArena::CleanupNode_*> pVar2;
  
  if (arena != (Arena *)0x0) {
    pVar2 = AllocateAlignedWithCleanup
                      (arena,0x18,
                       (type_info *)&RepeatedPtrField<google::protobuf::MessageLite>::typeinfo);
    pRVar1 = (RepeatedPtrField<google::protobuf::MessageLite> *)pVar2.first;
    (pVar2.second)->elem = pRVar1;
    (pVar2.second)->cleanup =
         internal::
         arena_destruct_object<google::protobuf::RepeatedPtrField<google::protobuf::MessageLite>>;
    (pRVar1->super_RepeatedPtrFieldBase).arena_ = arena;
    (pRVar1->super_RepeatedPtrFieldBase).current_size_ = 0;
    (pRVar1->super_RepeatedPtrFieldBase).total_size_ = 0;
    (pRVar1->super_RepeatedPtrFieldBase).rep_ = (Rep *)0x0;
    return pRVar1;
  }
  pRVar1 = (RepeatedPtrField<google::protobuf::MessageLite> *)operator_new(0x18);
  (pRVar1->super_RepeatedPtrFieldBase).arena_ = (Arena *)0x0;
  (pRVar1->super_RepeatedPtrFieldBase).current_size_ = 0;
  (pRVar1->super_RepeatedPtrFieldBase).total_size_ = 0;
  (pRVar1->super_RepeatedPtrFieldBase).rep_ = (Rep *)0x0;
  return pRVar1;
}

Assistant:

PROTOBUF_NDEBUG_INLINE static T* CreateMessageInternal(Arena* arena) {
    static_assert(
        InternalHelper<T>::is_arena_constructable::value,
        "CreateMessage can only construct types that are ArenaConstructable");
    if (arena == NULL) {
      // Generated arena constructor T(Arena*) is protected. Call via
      // InternalHelper.
      return InternalHelper<T>::New();
    } else {
      return arena->DoCreateMessage<T>();
    }
  }